

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LossParameter::SharedCtor(LossParameter *this)

{
  LossParameter *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->ignore_label_,0,5);
  this->normalization_ = 1;
  return;
}

Assistant:

void LossParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&ignore_label_, 0, reinterpret_cast<char*>(&normalize_) -
    reinterpret_cast<char*>(&ignore_label_) + sizeof(normalize_));
  normalization_ = 1;
}